

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void muxBlankPL(string *appDir,BlurayHelper *blurayHelper,PIDListMap *pidList,DiskType dt,
               int blankNum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer *ppdVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  BlurayHelper *this;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long *plVar10;
  _Base_ptr p_Var11;
  long lVar12;
  undefined8 *puVar13;
  ssize_t sVar14;
  mapped_type *pmVar15;
  TSMuxer *mainMuxer;
  undefined4 *puVar16;
  _func_int **pp_Var17;
  ulong uVar18;
  size_t __n;
  int __fd;
  _Alloc_hider _Var19;
  undefined8 uVar20;
  pointer pdVar21;
  undefined4 in_register_00000084;
  _Rb_tree_header *p_Var22;
  void *__buf;
  ulong __val;
  int iVar23;
  double dVar24;
  string __str;
  string tmpFileName;
  vector<double,_std::allocator<double>_> local_418;
  double local_3f0;
  DiskType local_3e4;
  File file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  videoParams;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 local_368;
  undefined7 uStack_367;
  undefined8 uStack_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348;
  undefined7 uStack_347;
  undefined8 uStack_340;
  BlurayHelper *local_338;
  undefined8 local_330;
  string *local_328;
  ostringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [46];
  
  local_330 = CONCAT44(in_register_00000084,blankNum);
  p_Var11 = (pidList->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var22 = &(pidList->_M_t)._M_impl.super__Rb_tree_header;
  local_3e4 = dt;
  local_338 = blurayHelper;
  local_328 = appDir;
  if ((_Rb_tree_header *)p_Var11 == p_Var22) {
    uVar7 = 0x780;
    uVar8 = 0x438;
    dVar24 = 23.976;
  }
  else {
    uVar8 = 0x438;
    uVar7 = 0x780;
    dVar24 = 23.976;
    do {
      if (p_Var11[6]._M_right == (_Base_ptr)0x0) {
        plVar10 = (long *)0x0;
      }
      else {
        local_3f0 = dVar24;
        plVar10 = (long *)__dynamic_cast(p_Var11[6]._M_right,&AbstractStreamReader::typeinfo,
                                         &MPEGStreamReader::typeinfo);
        dVar24 = local_3f0;
      }
      if (plVar10 != (long *)0x0) {
        uVar7 = (**(code **)(*plVar10 + 0xa0))(plVar10);
        uVar8 = (**(code **)(*plVar10 + 0xa8))(plVar10);
        dVar24 = (double)plVar10[0x11];
        break;
      }
      local_3f0 = dVar24;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      dVar24 = local_3f0;
    } while ((_Rb_tree_header *)p_Var11 != p_Var22);
  }
  bVar5 = false;
  if ((uVar7 < 0x357) && (bVar5 = false, uVar8 < 0x1e1)) {
    if (0.5 <= ABS(25.0 - dVar24)) {
      bVar5 = 0.5 <= ABS(50.0 - dVar24);
    }
    else {
      bVar5 = false;
    }
  }
  bVar6 = false;
  if (((uVar7 < 0x401) && (bVar6 = false, uVar8 < 0x241)) &&
     (bVar6 = true, 0.5 <= ABS(25.0 - dVar24))) {
    bVar6 = ABS(50.0 - dVar24) < 0.5;
  }
  iVar23 = 0x243c60;
  if (0x513 < uVar7) {
    iVar23 = 0x2439d0;
  }
  uVar8 = 0x151;
  if (0x513 < uVar7) {
    uVar8 = 0x284;
  }
  iVar9 = 0x243900;
  if (!bVar6) {
    iVar9 = iVar23;
  }
  uVar7 = 0xcc;
  if (!bVar6) {
    uVar7 = uVar8;
  }
  iVar23 = 0x243840;
  if (!bVar5) {
    iVar23 = iVar9;
  }
  __buf = (void *)0xba;
  if (!bVar5) {
    __buf = (void *)(ulong)uVar7;
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  videoParams._M_t._M_impl._0_8_ =
       &videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&videoParams,"blank_","");
  plVar10 = (long *)std::__cxx11::string::replace
                              ((ulong)&videoParams,0,(char *)0x0,
                               (ulong)(local_328->_M_dataplus)._M_p);
  uVar18 = lVar12 / 1000;
  psVar4 = &file.m_name;
  pp_Var17 = (_func_int **)(plVar10 + 2);
  if ((_func_int **)*plVar10 == pp_Var17) {
    file.m_name._M_dataplus._M_p = (pointer)*pp_Var17;
    file.m_name._M_string_length = plVar10[3];
    file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
         (AbstractStream)(AbstractStream)psVar4;
  }
  else {
    file.m_name._M_dataplus._M_p = (pointer)*pp_Var17;
    file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
         (AbstractStream)(AbstractStream)*plVar10;
  }
  file.m_impl = (void *)plVar10[1];
  *plVar10 = (long)pp_Var17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  __val = -uVar18;
  if (0 < (long)uVar18) {
    __val = uVar18;
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar18 = __val;
    uVar8 = 4;
    do {
      uVar7 = uVar8;
      if (uVar18 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001973c1;
      }
      if (uVar18 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001973c1;
      }
      if (uVar18 < 10000) goto LAB_001973c1;
      bVar5 = 99999 < uVar18;
      uVar18 = uVar18 / 10000;
      uVar8 = uVar7 + 4;
    } while (bVar5);
    uVar7 = uVar7 + 1;
  }
LAB_001973c1:
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,(lVar12 < -999) + (char)uVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p + (lVar12 < -999),uVar7,__val);
  _Var19._M_p = (pointer)0xf;
  if (file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream !=
      (AbstractStream)psVar4) {
    _Var19 = file.m_name._M_dataplus;
  }
  if (_Var19._M_p < (pointer)(__str._M_string_length + (long)file.m_impl)) {
    uVar20 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      uVar20 = __str.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < (pointer)(__str._M_string_length + (long)file.m_impl)) goto LAB_00197448;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&__str,0,(char *)0x0,
                         (ulong)file.super_AbstractOutputStream.super_AbstractStream.
                                _vptr_AbstractStream);
  }
  else {
LAB_00197448:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&file,(ulong)__str._M_dataplus._M_p);
  }
  _ss = (pointer)local_310;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar1) {
    local_310[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_310[0]._8_8_ = puVar13[3];
  }
  else {
    local_310[0]._0_8_ = paVar1->_M_allocated_capacity;
    _ss = (pointer)*puVar13;
  }
  lVar12 = puVar13[1];
  *puVar13 = paVar1;
  puVar13[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  ppdVar3 = &local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppdVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,".264","");
  uVar20 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_310) {
    uVar20 = local_310[0]._M_allocated_capacity;
  }
  if ((ulong)uVar20 <
      (pointer)((long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar12)) {
    pdVar21 = (pointer)0xf;
    if ((pointer *)
        local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != ppdVar3) {
      pdVar21 = local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if ((pointer)((long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + lVar12) <= pdVar21) {
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,(ulong)_ss);
      goto LAB_00197542;
    }
  }
  puVar13 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&ss,
                       (ulong)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
LAB_00197542:
  tmpFileName._M_dataplus._M_p = (pointer)&tmpFileName.field_2;
  psVar2 = puVar13 + 2;
  if ((size_type *)*puVar13 == psVar2) {
    tmpFileName.field_2._M_allocated_capacity = *psVar2;
    tmpFileName.field_2._8_8_ = puVar13[3];
  }
  else {
    tmpFileName.field_2._M_allocated_capacity = *psVar2;
    tmpFileName._M_dataplus._M_p = (pointer)*puVar13;
  }
  tmpFileName._M_string_length = puVar13[1];
  *puVar13 = psVar2;
  puVar13[1] = 0;
  *(char *)psVar2 = '\0';
  if ((pointer *)
      local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != ppdVar3) {
    operator_delete(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_310) {
    operator_delete(_ss,local_310[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream !=
      (AbstractStream)psVar4) {
    operator_delete((void *)file.super_AbstractOutputStream.super_AbstractStream.
                            _vptr_AbstractStream,(ulong)(file.m_name._M_dataplus._M_p + 1));
  }
  paVar1 = &__str.field_2;
  if ((_Base_ptr *)videoParams._M_t._M_impl._0_8_ !=
      &videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)videoParams._M_t._M_impl._0_8_,
                    (ulong)((long)&(videoParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  File::File(&file);
  __n = 0;
  iVar9 = File::open(&file,tmpFileName._M_dataplus._M_p,2);
  if ((char)iVar9 != '\0') {
    iVar9 = 3;
    do {
      __fd = iVar23;
      sVar14 = File::write(&file,iVar23,__buf,__n);
      if ((int)sVar14 != (int)__buf) {
        deleteFile(&tmpFileName);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ss,"can\'t write data to file ",0x19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ss,tmpFileName._M_dataplus._M_p,tmpFileName._M_string_length);
        puVar16 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar16 = 3;
        *(undefined4 **)(puVar16 + 2) = puVar16 + 6;
        if (local_378 == &local_368) {
          *(ulong *)(puVar16 + 6) = CONCAT71(uStack_367,local_368);
          *(undefined8 *)(puVar16 + 8) = uStack_360;
        }
        else {
          *(undefined1 **)(puVar16 + 2) = local_378;
          *(ulong *)(puVar16 + 6) = CONCAT71(uStack_367,local_368);
        }
        *(undefined8 *)(puVar16 + 4) = local_370;
        local_368 = 0;
        __cxa_throw(puVar16,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    File::close(&file,__fd);
    videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &videoParams._M_t._M_impl.super__Rb_tree_header._M_header;
    videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    videoParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    _ss = (pointer)local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"insertSEI","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&videoParams,(key_type *)&ss);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ss != local_310) {
      operator_delete(_ss,local_310[0]._M_allocated_capacity + 1);
    }
    _ss = (pointer)local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"fps","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&videoParams,(key_type *)&ss);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x208cae);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ss != local_310) {
      operator_delete(_ss,local_310[0]._M_allocated_capacity + 1);
    }
    MuxerManager::MuxerManager
              ((MuxerManager *)&ss,&readManager,&tsMuxerFactory.super_AbstractMuxerFactory);
    uVar20 = local_330;
    this = local_338;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str,"MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500","");
    MuxerManager::parseMuxOpt((MuxerManager *)&ss,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"V_MPEG4/ISO/AVC","");
    MuxerManager::addStream((MuxerManager *)&ss,&__str,&tmpFileName,&videoParams);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    iVar23 = (int)uVar20;
    BlurayHelper::m2tsFileName_abi_cxx11_(&__str,this,iVar23);
    MuxerManager::doMux((MuxerManager *)&ss,&__str,&this->super_FileFactory);
    mainMuxer = (TSMuxer *)MuxerManager::getMainMuxer((MuxerManager *)&ss);
    if ((mainMuxer == (TSMuxer *)0x0) ||
       ((mainMuxer->super_AbstractMuxer)._vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_00242648
       )) {
      mainMuxer = (TSMuxer *)0x0;
    }
    local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BlurayHelper::createMPLSFile(this,mainMuxer,(TSMuxer *)0x0,0,&local_418,local_3e4,iVar23,false);
    if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    BlurayHelper::createCLPIFile(this,mainMuxer,iVar23,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    MuxerManager::~MuxerManager((MuxerManager *)&ss);
    deleteFile(&tmpFileName);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&videoParams._M_t);
    File::~File(&file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tmpFileName._M_dataplus._M_p != &tmpFileName.field_2) {
      operator_delete(tmpFileName._M_dataplus._M_p,tmpFileName.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"can\'t create file ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ss,tmpFileName._M_dataplus._M_p,tmpFileName._M_string_length);
  puVar16 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar16 = 3;
  *(undefined4 **)(puVar16 + 2) = puVar16 + 6;
  if (local_358 == &local_348) {
    *(ulong *)(puVar16 + 6) = CONCAT71(uStack_347,local_348);
    *(undefined8 *)(puVar16 + 8) = uStack_340;
  }
  else {
    *(undefined1 **)(puVar16 + 2) = local_358;
    *(ulong *)(puVar16 + 6) = CONCAT71(uStack_347,local_348);
  }
  *(undefined8 *)(puVar16 + 4) = local_350;
  local_350 = 0;
  local_348 = 0;
  local_358 = &local_348;
  __cxa_throw(puVar16,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void muxBlankPL(const string& appDir, BlurayHelper& blurayHelper, const PIDListMap& pidList, DiskType dt, int blankNum)
{
    unsigned videoWidth = 1920;
    unsigned videoHeight = 1080;
    double fps = 23.976;
    for (const auto& [pid, si] : pidList)
    {
        const PMTStreamInfo& streamInfo = si;
        const auto streamReader = dynamic_cast<const MPEGStreamReader*>(streamInfo.m_codecReader);
        if (streamReader)
        {
            videoWidth = streamReader->getStreamWidth();
            videoHeight = streamReader->getStreamHeight();
            fps = streamReader->getFPS();
            break;
        }
    }
    uint8_t* pattern;
    int patternSize;
    bool isNtsc = videoWidth <= 854 && videoHeight <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    bool isPal = videoWidth <= 1024 && videoHeight <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
    {
        pattern = pattern_ntsc;
        patternSize = sizeof(pattern_ntsc);
    }
    else if (isPal)
    {
        pattern = pattern_pal;
        patternSize = sizeof(pattern_pal);
    }
    else if (videoWidth >= 1300)
    {
        pattern = pattern_1920;
        patternSize = sizeof(pattern_1920);
    }
    else
    {
        pattern = pattern_1280;
        patternSize = sizeof(pattern_1280);
    }
    auto fname_time = std::chrono::duration_cast<std::chrono::microseconds>(
                          std::chrono::high_resolution_clock::now().time_since_epoch())
                          .count();
    string tmpFileName = appDir + string("blank_") + std::to_string(fname_time) + string(".264");
    File file;
    if (!file.open(tmpFileName.c_str(), File::ofWrite))
        THROW(ERR_COMMON, "can't create file " << tmpFileName)
    for (int i = 0; i < 3; ++i)
    {
        if (file.write(pattern, patternSize) != patternSize)
        {
            deleteFile(tmpFileName);
            THROW(ERR_COMMON, "can't write data to file " << tmpFileName)
        }
    }
    file.close();
    map<string, string> videoParams;
    videoParams["insertSEI"];
    videoParams["fps"] = "23.976";
    {
        MuxerManager muxerManager(readManager, tsMuxerFactory);
        muxerManager.parseMuxOpt("MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500");
        muxerManager.addStream("V_MPEG4/ISO/AVC", tmpFileName, videoParams);
        string dstFile = blurayHelper.m2tsFileName(blankNum);
        muxerManager.doMux(dstFile, &blurayHelper);

        auto tsMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());

        blurayHelper.createMPLSFile(tsMuxer, nullptr, 0, vector<double>(), dt, blankNum, false);
        blurayHelper.createCLPIFile(tsMuxer, blankNum, true);
    }
    deleteFile(tmpFileName);
}